

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::ShowMetricsWindow(bool *p_open)

{
  bool *v;
  float fVar1;
  float fVar2;
  ImGuiWindow *pIVar3;
  ImGuiViewportP *pIVar4;
  ImGuiPopupData *pIVar5;
  undefined8 *puVar6;
  ImFontAtlas *atlas;
  undefined1 auVar7 [16];
  ImGuiContext *pIVar8;
  ImGuiContext *pIVar9;
  bool bVar10;
  ImGuiContext *g;
  ImGuiTable *pIVar11;
  ImDrawList *pIVar12;
  ImGuiTabBar *tab_bar;
  ImU32 col;
  ImGuiContext *g_8;
  long lVar13;
  char *pcVar14;
  char *pcVar15;
  int rect_n;
  ulong uVar16;
  ImPool<ImGuiTable> *this;
  ImGuiWindowSettings *p;
  ImGuiTableSettings *settings;
  undefined **ppuVar17;
  long lVar18;
  char **ppcVar19;
  int count;
  int iVar20;
  long lVar21;
  ImVector<ImDrawList_*> *pIVar22;
  ImGuiContext *g_6;
  uint uVar23;
  int iVar24;
  ImGuiWindow *window;
  ulong uVar25;
  byte bVar26;
  float fVar27;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dd;
  undefined4 extraout_XMM0_Dd_00;
  float fVar28;
  undefined4 uVar29;
  undefined4 uVar30;
  undefined4 uVar31;
  undefined4 uVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  ImRect IVar37;
  ImVec2 local_1e0;
  ImGuiMetricsConfig *local_1d8;
  int *local_1d0;
  undefined1 local_1c8 [16];
  int *local_1b8;
  ImVec2 local_1b0;
  float local_1a8;
  float fStack_1a4;
  float fStack_1a0;
  float fStack_19c;
  undefined1 local_198 [16];
  float local_188;
  float fStack_184;
  float fStack_180;
  float fStack_17c;
  undefined1 local_178 [16];
  undefined1 local_168 [16];
  char buf [128];
  char *wrt_rects_names [8];
  char *trt_rects_names [13];
  
  bVar26 = 0;
  bVar10 = Begin("Dear ImGui Metrics/Debugger",p_open,0);
  pIVar8 = GImGui;
  if (!bVar10) {
    End();
    return;
  }
  Text("Dear ImGui %s","1.84 WIP");
  uVar29 = 0;
  uVar31 = 0;
  Text("Application average %.3f ms/frame (%.1f FPS)",
       SUB84((double)(1000.0 / (pIVar8->IO).Framerate),0));
  iVar20 = (pIVar8->IO).MetricsRenderIndices;
  Text("%d vertices, %d indices (%d triangles)",(ulong)(uint)(pIVar8->IO).MetricsRenderVertices,
       (long)iVar20,(ulong)(uint)(iVar20 / 3));
  Text("%d active windows (%d visible)",(ulong)(uint)(pIVar8->IO).MetricsActiveWindows,
       (ulong)(uint)(pIVar8->IO).MetricsRenderWindows);
  Text("%d active allocations",(ulong)(uint)(pIVar8->IO).MetricsActiveAllocations);
  Separator();
  wrt_rects_names[6] = "ContentIdeal";
  wrt_rects_names[7] = "ContentRegionRect";
  wrt_rects_names[4] = "WorkRect";
  wrt_rects_names[5] = "Content";
  wrt_rects_names[2] = "InnerRect";
  wrt_rects_names[3] = "InnerClipRect";
  wrt_rects_names[0] = "OuterRect";
  wrt_rects_names[1] = "OuterRectClipped";
  ppuVar17 = &PTR_anon_var_dwarf_5e6c3_003f1230;
  ppcVar19 = trt_rects_names;
  for (lVar13 = 0xd; lVar13 != 0; lVar13 = lVar13 + -1) {
    *ppcVar19 = *ppuVar17;
    ppuVar17 = ppuVar17 + (ulong)bVar26 * -2 + 1;
    ppcVar19 = ppcVar19 + (ulong)bVar26 * -2 + 1;
  }
  local_1b8 = &(pIVar8->DebugMetricsConfig).ShowWindowsRectsType;
  if ((pIVar8->DebugMetricsConfig).ShowWindowsRectsType < 0) {
    *local_1b8 = 4;
  }
  local_1d0 = &(pIVar8->DebugMetricsConfig).ShowTablesRectsType;
  if ((pIVar8->DebugMetricsConfig).ShowTablesRectsType < 0) {
    *local_1d0 = 2;
  }
  local_1d8 = &pIVar8->DebugMetricsConfig;
  bVar10 = TreeNode("Tools");
  if (bVar10) {
    auVar7._8_8_ = 0;
    auVar7[0] = buf[8];
    auVar7[1] = buf[9];
    auVar7[2] = buf[10];
    auVar7[3] = buf[0xb];
    auVar7[4] = buf[0xc];
    auVar7[5] = buf[0xd];
    auVar7[6] = buf[0xe];
    auVar7[7] = buf[0xf];
    buf._0_16_ = auVar7 << 0x40;
    bVar10 = Button("Item Picker..",(ImVec2 *)buf);
    if (bVar10) {
      GImGui->DebugItemPickerActive = true;
    }
    pIVar9 = GImGui;
    pIVar3 = GImGui->CurrentWindow;
    pIVar3->WriteAccessed = true;
    if (pIVar3->SkipItems == false) {
      (pIVar3->DC).CursorPos.x = (pIVar9->Style).ItemSpacing.x + (pIVar3->DC).CursorPosPrevLine.x;
      (pIVar3->DC).CursorPos.y = (pIVar3->DC).CursorPosPrevLine.y;
      (pIVar3->DC).CurrLineSize = (pIVar3->DC).PrevLineSize;
      (pIVar3->DC).CurrLineTextBaseOffset = (pIVar3->DC).PrevLineTextBaseOffset;
    }
    MetricsHelpMarker(
                     "Will call the IM_DEBUG_BREAK() macro to break in debugger.\nWarning: If you don\'t have a debugger attached, this will probably crash."
                     );
    Checkbox("Show windows begin order",&(pIVar8->DebugMetricsConfig).ShowWindowsBeginOrder);
    Checkbox("Show windows rectangles",&local_1d8->ShowWindowsRects);
    pIVar9 = GImGui;
    pIVar3 = GImGui->CurrentWindow;
    pIVar3->WriteAccessed = true;
    if (pIVar3->SkipItems == false) {
      (pIVar3->DC).CursorPos.x = (pIVar9->Style).ItemSpacing.x + (pIVar3->DC).CursorPosPrevLine.x;
      (pIVar3->DC).CursorPos.y = (pIVar3->DC).CursorPosPrevLine.y;
      (pIVar3->DC).CurrLineSize = (pIVar3->DC).PrevLineSize;
      (pIVar3->DC).CurrLineTextBaseOffset = (pIVar3->DC).PrevLineTextBaseOffset;
    }
    fVar27 = pIVar9->FontSize;
    *(byte *)&(pIVar9->NextItemData).Flags = (byte)(pIVar9->NextItemData).Flags | 1;
    (pIVar9->NextItemData).Width = fVar27 * 12.0;
    bVar10 = Combo("##show_windows_rect_type",local_1b8,wrt_rects_names,8,8);
    local_1d8->ShowWindowsRects = (bool)(local_1d8->ShowWindowsRects | bVar10);
    if ((local_1d8->ShowWindowsRects != false) && (pIVar8->NavWindow != (ImGuiWindow *)0x0)) {
      lVar13 = 0;
      BulletText("\'%s\':",pIVar8->NavWindow->Name);
      pIVar9 = GImGui;
      pIVar3 = GImGui->CurrentWindow;
      pIVar3->WriteAccessed = true;
      fVar27 = (pIVar9->Style).IndentSpacing + (pIVar3->DC).Indent.x;
      (pIVar3->DC).Indent.x = fVar27;
      (pIVar3->DC).CursorPos.x = fVar27 + (pIVar3->Pos).x + (pIVar3->DC).ColumnsOffset.x;
      do {
        IVar37 = ShowMetricsWindow::Funcs::GetWindowRect(pIVar8->NavWindow,(int)lVar13);
        uVar29 = 0;
        uVar31 = 0;
        Text("(%6.1f,%6.1f) (%6.1f,%6.1f) Size (%6.1f,%6.1f) %s",SUB84((double)IVar37.Min.x,0),
             (double)IVar37.Min.y,SUB84((double)IVar37.Max.x,0),(double)IVar37.Max.y,
             SUB84((double)(IVar37.Max.x - IVar37.Min.x),0),
             SUB84((double)(IVar37.Max.y - IVar37.Min.y),0),wrt_rects_names[lVar13]);
        pIVar9 = GImGui;
        lVar13 = lVar13 + 1;
      } while (lVar13 != 8);
      pIVar3 = GImGui->CurrentWindow;
      pIVar3->WriteAccessed = true;
      fVar27 = (pIVar3->DC).Indent.x - (pIVar9->Style).IndentSpacing;
      (pIVar3->DC).Indent.x = fVar27;
      (pIVar3->DC).CursorPos.x = fVar27 + (pIVar3->Pos).x + (pIVar3->DC).ColumnsOffset.x;
    }
    Checkbox("Show ImDrawCmd mesh when hovering",&(pIVar8->DebugMetricsConfig).ShowDrawCmdMesh);
    Checkbox("Show ImDrawCmd bounding boxes when hovering",
             &(pIVar8->DebugMetricsConfig).ShowDrawCmdBoundingBoxes);
    v = &(pIVar8->DebugMetricsConfig).ShowTablesRects;
    Checkbox("Show tables rectangles",v);
    pIVar9 = GImGui;
    pIVar3 = GImGui->CurrentWindow;
    pIVar3->WriteAccessed = true;
    if (pIVar3->SkipItems == false) {
      (pIVar3->DC).CursorPos.x = (pIVar9->Style).ItemSpacing.x + (pIVar3->DC).CursorPosPrevLine.x;
      (pIVar3->DC).CursorPos.y = (pIVar3->DC).CursorPosPrevLine.y;
      (pIVar3->DC).CurrLineSize = (pIVar3->DC).PrevLineSize;
      (pIVar3->DC).CurrLineTextBaseOffset = (pIVar3->DC).PrevLineTextBaseOffset;
    }
    fVar27 = pIVar9->FontSize;
    *(byte *)&(pIVar9->NextItemData).Flags = (byte)(pIVar9->NextItemData).Flags | 1;
    (pIVar9->NextItemData).Width = fVar27 * 12.0;
    bVar10 = Combo("##show_table_rects_type",local_1d0,trt_rects_names,0xd,0xd);
    *v = (bool)(*v | bVar10);
    if ((*v == false) || (pIVar8->NavWindow == (ImGuiWindow *)0x0)) {
LAB_00155c30:
      TreePop();
      goto LAB_00155c3a;
    }
    iVar20 = (pIVar8->Tables).Buf.Size;
    if (iVar20 == (pIVar8->Tables).Map.Data.Size) {
      this = &pIVar8->Tables;
      iVar24 = 0;
      local_178._0_8_ = this;
      do {
        if (iVar20 <= iVar24) goto LAB_00155c30;
        pIVar11 = ImPool<ImGuiTable>::TryGetBufData(this,iVar24);
        if ((pIVar11 != (ImGuiTable *)0x0) && (pIVar8->FrameCount + -1 <= pIVar11->LastFrameActive))
        {
          if ((pIVar11->OuterWindow == pIVar8->NavWindow) ||
             (pIVar11->InnerWindow == pIVar8->NavWindow)) {
            BulletText("Table 0x%08X (%d columns, in \'%s\')",(ulong)pIVar11->ID,
                       (ulong)(uint)pIVar11->ColumnsCount,pIVar11->OuterWindow->Name);
            bVar10 = IsItemHovered(0);
            if (bVar10) {
              pIVar12 = GetForegroundDrawList();
              auVar7 = buf._0_16_;
              buf._4_4_ = (pIVar11->OuterRect).Min.y + -1.0;
              buf._0_4_ = (pIVar11->OuterRect).Min.x + -1.0;
              buf._8_8_ = auVar7._8_8_;
              local_1e0.y = (pIVar11->OuterRect).Max.y + 1.0;
              local_1e0.x = (pIVar11->OuterRect).Max.x + 1.0;
              uVar29 = 0;
              uVar31 = 0;
              ImDrawList::AddRect(pIVar12,(ImVec2 *)buf,&local_1e0,0xff00ffff,0.0,0,2.0);
            }
            pIVar9 = GImGui;
            pIVar3 = GImGui->CurrentWindow;
            pIVar3->WriteAccessed = true;
            fVar27 = (pIVar9->Style).IndentSpacing + (pIVar3->DC).Indent.x;
            (pIVar3->DC).Indent.x = fVar27;
            (pIVar3->DC).CursorPos.x = fVar27 + (pIVar3->Pos).x + (pIVar3->DC).ColumnsOffset.x;
            uVar16 = 0;
            uVar30 = uVar29;
            uVar32 = uVar31;
            do {
              iVar20 = (int)uVar16;
              if (uVar16 < 6) {
                IVar37 = ShowMetricsWindow::Funcs::GetTableRect(pIVar11,iVar20,-1);
                local_1a8 = IVar37.Min.y;
                local_188 = IVar37.Max.y;
                uVar29 = 0;
                uVar31 = 0;
                local_1c8._8_4_ = uVar30;
                local_1c8._0_4_ = IVar37.Max.x;
                local_1c8._4_4_ = IVar37.Max.y;
                local_1c8._12_4_ = uVar32;
                local_198._8_4_ = extraout_XMM0_Dc_00;
                local_198._0_4_ = IVar37.Min.x;
                local_198._4_4_ = IVar37.Min.y;
                local_198._12_4_ = extraout_XMM0_Dd_00;
                fStack_1a4 = local_1a8;
                fStack_1a0 = local_1a8;
                fStack_19c = local_1a8;
                fStack_184 = local_188;
                fStack_180 = local_188;
                fStack_17c = local_188;
                ImFormatString(buf,0x80,"(%6.1f,%6.1f) (%6.1f,%6.1f) Size (%6.1f,%6.1f) %s",
                               SUB84((double)IVar37.Min.x,0),(double)local_1a8,
                               SUB84((double)IVar37.Max.x,0),(double)local_188,
                               SUB84((double)(IVar37.Max.x - IVar37.Min.x),0),
                               SUB84((double)(local_188 - local_1a8),0),trt_rects_names[uVar16]);
                local_1e0.x = 0.0;
                local_1e0.y = 0.0;
                Selectable(buf,false,0,&local_1e0);
                bVar10 = IsItemHovered(0);
                if (bVar10) {
                  pIVar12 = GetForegroundDrawList();
                  local_1e0.x = (float)local_198._0_4_ + -1.0;
                  local_1e0.y = local_1a8 + -1.0;
                  local_1b0.x = (float)local_1c8._0_4_ + 1.0;
                  local_1b0.y = local_188 + 1.0;
                  uVar29 = 0;
                  uVar31 = 0;
                  ImDrawList::AddRect(pIVar12,&local_1e0,&local_1b0,0xff00ffff,0.0,0,2.0);
                }
              }
              else {
                uVar29 = uVar30;
                uVar31 = uVar32;
                if (((iVar20 == 8) || (iVar20 == 6)) && (0 < pIVar11->ColumnsCount)) {
                  uVar25 = 0;
                  do {
                    IVar37 = ShowMetricsWindow::Funcs::GetTableRect(pIVar11,iVar20,(int)uVar25);
                    local_1a8 = IVar37.Min.y;
                    local_188 = IVar37.Max.y;
                    uVar29 = 0;
                    uVar31 = 0;
                    local_1c8._8_4_ = uVar30;
                    local_1c8._0_4_ = IVar37.Max.x;
                    local_1c8._4_4_ = IVar37.Max.y;
                    local_1c8._12_4_ = uVar32;
                    local_198._8_4_ = extraout_XMM0_Dc;
                    local_198._0_4_ = IVar37.Min.x;
                    local_198._4_4_ = IVar37.Min.y;
                    local_198._12_4_ = extraout_XMM0_Dd;
                    fStack_1a4 = local_1a8;
                    fStack_1a0 = local_1a8;
                    fStack_19c = local_1a8;
                    fStack_184 = local_188;
                    fStack_180 = local_188;
                    fStack_17c = local_188;
                    ImFormatString(buf,0x80,
                                   "(%6.1f,%6.1f) (%6.1f,%6.1f) Size (%6.1f,%6.1f) Col %d %s",
                                   SUB84((double)IVar37.Min.x,0),(double)local_1a8,
                                   SUB84((double)IVar37.Max.x,0),(double)local_188,
                                   SUB84((double)(IVar37.Max.x - IVar37.Min.x),0),
                                   SUB84((double)(local_188 - local_1a8),0),uVar25);
                    local_1e0.x = 0.0;
                    local_1e0.y = 0.0;
                    Selectable(buf,false,0,&local_1e0);
                    bVar10 = IsItemHovered(0);
                    if (bVar10) {
                      pIVar12 = GetForegroundDrawList();
                      local_1e0.x = (float)local_198._0_4_ + -1.0;
                      local_1e0.y = local_1a8 + -1.0;
                      local_1b0.x = (float)local_1c8._0_4_ + 1.0;
                      local_1b0.y = local_188 + 1.0;
                      uVar29 = 0;
                      uVar31 = 0;
                      ImDrawList::AddRect(pIVar12,&local_1e0,&local_1b0,0xff00ffff,0.0,0,2.0);
                    }
                    uVar23 = (int)uVar25 + 1;
                    uVar25 = (ulong)uVar23;
                    uVar30 = uVar29;
                    uVar32 = uVar31;
                  } while ((int)uVar23 < pIVar11->ColumnsCount);
                }
              }
              pIVar9 = GImGui;
              uVar16 = uVar16 + 1;
              uVar30 = uVar29;
              uVar32 = uVar31;
            } while (uVar16 != 0xd);
            pIVar3 = GImGui->CurrentWindow;
            pIVar3->WriteAccessed = true;
            fVar27 = (pIVar3->DC).Indent.x - (pIVar9->Style).IndentSpacing;
            (pIVar3->DC).Indent.x = fVar27;
            (pIVar3->DC).CursorPos.x = fVar27 + (pIVar3->Pos).x + (pIVar3->DC).ColumnsOffset.x;
            this = (ImPool<ImGuiTable> *)local_178._0_8_;
          }
        }
        iVar24 = iVar24 + 1;
        iVar20 = (pIVar8->Tables).Buf.Size;
      } while (iVar20 == (pIVar8->Tables).Map.Data.Size);
    }
  }
  else {
LAB_00155c3a:
    local_198._0_8_ = &pIVar8->Windows;
    DebugNodeWindowsList(&pIVar8->Windows,"Windows");
    lVar13 = (long)(pIVar8->Viewports).Size;
    if (lVar13 < 1) {
      uVar16 = 0;
    }
    else {
      lVar18 = 0;
      uVar16 = 0;
      do {
        lVar21 = 0;
        iVar20 = 0;
        do {
          iVar20 = iVar20 + *(int *)((long)&((pIVar8->Viewports).Data[lVar18]->DrawDataBuilder).
                                            Layers[0].Size + lVar21);
          lVar21 = lVar21 + 0x10;
        } while (lVar21 == 0x10);
        uVar16 = (ulong)(uint)((int)uVar16 + iVar20);
        lVar18 = lVar18 + 1;
      } while (lVar18 != lVar13);
    }
    bVar10 = TreeNode("DrawLists","DrawLists (%d)",uVar16);
    if (bVar10) {
      if (0 < (pIVar8->Viewports).Size) {
        lVar13 = 0;
        do {
          pIVar4 = (pIVar8->Viewports).Data[lVar13];
          lVar18 = 0;
          do {
            if (0 < (pIVar4->DrawDataBuilder).Layers[lVar18].Size) {
              pIVar22 = (pIVar4->DrawDataBuilder).Layers + lVar18;
              lVar21 = 0;
              do {
                DebugNodeDrawList((ImGuiWindow *)0x0,pIVar22->Data[lVar21],"DrawList");
                lVar21 = lVar21 + 1;
              } while (lVar21 < pIVar22->Size);
            }
            bVar10 = lVar18 == 0;
            lVar18 = lVar18 + 1;
          } while (bVar10);
          lVar13 = lVar13 + 1;
        } while (lVar13 < (pIVar8->Viewports).Size);
      }
      TreePop();
    }
    bVar10 = TreeNode("Viewports","Viewports (%d)",(ulong)(uint)(pIVar8->Viewports).Size);
    if (bVar10) {
      fVar27 = GetTreeNodeToLabelSpacing();
      pIVar9 = GImGui;
      pIVar3 = GImGui->CurrentWindow;
      pIVar3->WriteAccessed = true;
      if ((fVar27 == 0.0) && (!NAN(fVar27))) {
        fVar27 = (pIVar9->Style).IndentSpacing;
      }
      fVar27 = fVar27 + (pIVar3->DC).Indent.x;
      (pIVar3->DC).Indent.x = fVar27;
      fVar27 = fVar27 + (pIVar3->Pos).x + (pIVar3->DC).ColumnsOffset.x;
      (pIVar3->DC).CursorPos.x = fVar27;
      iVar20 = (pIVar9->Viewports).Size;
      if ((long)iVar20 < 1) {
        fVar35 = -3.4028235e+38;
        local_1a8 = 3.4028235e+38;
        fVar34 = 3.4028235e+38;
        fVar36 = -3.4028235e+38;
      }
      else {
        fVar34 = 3.4028235e+38;
        lVar13 = 0;
        local_1a8 = 3.4028235e+38;
        fVar28 = -3.4028235e+38;
        fVar33 = -3.4028235e+38;
        do {
          pIVar4 = (pIVar9->Viewports).Data[lVar13];
          fVar1 = (pIVar4->super_ImGuiViewport).Pos.x;
          fVar2 = (pIVar4->super_ImGuiViewport).Pos.y;
          fVar35 = (pIVar4->super_ImGuiViewport).Size.x + fVar1;
          if (fVar35 <= fVar33) {
            fVar35 = fVar33;
          }
          fVar36 = (pIVar4->super_ImGuiViewport).Size.y + fVar2;
          if (fVar36 <= fVar28) {
            fVar36 = fVar28;
          }
          if (local_1a8 <= fVar1) {
            fVar1 = local_1a8;
          }
          local_1a8 = fVar1;
          if (fVar34 <= fVar2) {
            fVar2 = fVar34;
          }
          fVar34 = fVar2;
          lVar13 = lVar13 + 1;
          fVar28 = fVar36;
          fVar33 = fVar35;
        } while (iVar20 != lVar13);
      }
      local_168 = ZEXT416((uint)fVar36);
      local_178 = ZEXT416((uint)fVar35);
      if (0 < iVar20) {
        local_188 = (pIVar3->DC).CursorPos.y - fVar34 * 0.125;
        fVar27 = fVar27 - local_1a8 * 0.125;
        lVar13 = 0;
        local_1c8._0_4_ = fVar27;
        do {
          pIVar4 = (pIVar9->Viewports).Data[lVar13];
          fVar35 = (pIVar4->super_ImGuiViewport).Pos.x;
          fVar36 = (pIVar4->super_ImGuiViewport).Pos.y;
          buf._4_4_ = fVar36 * 0.125 + local_188;
          buf._0_4_ = fVar35 * 0.125 + fVar27;
          buf._8_4_ = (fVar35 + (pIVar4->super_ImGuiViewport).Size.x) * 0.125 + fVar27;
          buf._12_4_ = (fVar36 + (pIVar4->super_ImGuiViewport).Size.y) * 0.125 + local_188;
          DebugRenderViewportThumbnail(pIVar3->DrawList,pIVar4,(ImRect *)buf);
          lVar13 = lVar13 + 1;
          fVar27 = (float)local_1c8._0_4_;
        } while (lVar13 < (pIVar9->Viewports).Size);
      }
      buf._4_4_ = ((float)local_168._0_4_ - fVar34) * 0.125;
      buf._0_4_ = ((float)local_178._0_4_ - local_1a8) * 0.125;
      Dummy((ImVec2 *)buf);
      fVar27 = GetTreeNodeToLabelSpacing();
      pIVar9 = GImGui;
      pIVar3 = GImGui->CurrentWindow;
      pIVar3->WriteAccessed = true;
      if ((fVar27 == 0.0) && (!NAN(fVar27))) {
        fVar27 = (pIVar9->Style).IndentSpacing;
      }
      fVar27 = (pIVar3->DC).Indent.x - fVar27;
      (pIVar3->DC).Indent.x = fVar27;
      (pIVar3->DC).CursorPos.x = fVar27 + (pIVar3->Pos).x + (pIVar3->DC).ColumnsOffset.x;
      if (0 < (pIVar8->Viewports).Size) {
        lVar13 = 0;
        do {
          DebugNodeViewport((pIVar8->Viewports).Data[lVar13]);
          lVar13 = lVar13 + 1;
        } while (lVar13 < (pIVar8->Viewports).Size);
      }
      TreePop();
    }
    bVar10 = TreeNode("Popups","Popups (%d)",(ulong)(uint)(pIVar8->OpenPopupStack).Size);
    if (bVar10) {
      if (0 < (pIVar8->OpenPopupStack).Size) {
        lVar18 = 8;
        lVar13 = 0;
        do {
          pIVar5 = (pIVar8->OpenPopupStack).Data;
          puVar6 = *(undefined8 **)((long)&pIVar5->PopupId + lVar18);
          pcVar15 = "NULL";
          if (puVar6 != (undefined8 *)0x0) {
            pcVar15 = (char *)*puVar6;
          }
          pcVar14 = "";
          if ((puVar6 != (undefined8 *)0x0) &&
             (pcVar14 = " ChildWindow", (*(byte *)((long)puVar6 + 0xf) & 1) == 0)) {
            pcVar14 = "";
          }
          BulletText("PopupID: %08x, Window: \'%s\'%s%s",
                     (ulong)*(uint *)((long)pIVar5 + lVar18 + -8),pcVar15,pcVar14);
          lVar13 = lVar13 + 1;
          lVar18 = lVar18 + 0x30;
        } while (lVar13 < (pIVar8->OpenPopupStack).Size);
      }
      TreePop();
    }
    bVar10 = TreeNode("TabBars","Tab Bars (%d)",(ulong)(uint)(pIVar8->TabBars).AliveCount);
    if (bVar10) {
      iVar20 = (pIVar8->TabBars).Buf.Size;
      if (iVar20 == (pIVar8->TabBars).Map.Data.Size) {
        iVar24 = 0;
        do {
          if (iVar20 <= iVar24) {
            TreePop();
            goto LAB_00156146;
          }
          tab_bar = ImPool<ImGuiTabBar>::TryGetBufData(&pIVar8->TabBars,iVar24);
          if (tab_bar != (ImGuiTabBar *)0x0) {
            PushID(tab_bar);
            DebugNodeTabBar(tab_bar,"TabBar");
            PopID();
          }
          iVar24 = iVar24 + 1;
          iVar20 = (pIVar8->TabBars).Buf.Size;
        } while (iVar20 == (pIVar8->TabBars).Map.Data.Size);
      }
      pcVar15 = "int ImPool<ImGuiTabBar>::GetBufSize() const [T = ImGuiTabBar]";
      goto LAB_00156c30;
    }
LAB_00156146:
    local_1c8._0_8_ = &pIVar8->Tables;
    bVar10 = TreeNode("Tables","Tables (%d)",(ulong)(uint)(pIVar8->Tables).AliveCount);
    if (bVar10) {
      iVar20 = (pIVar8->Tables).Buf.Size;
      if (iVar20 == (pIVar8->Tables).Map.Data.Size) {
        iVar24 = 0;
        do {
          if (iVar20 <= iVar24) {
            TreePop();
            goto LAB_001561c1;
          }
          pIVar11 = ImPool<ImGuiTable>::TryGetBufData((ImPool<ImGuiTable> *)local_1c8._0_8_,iVar24);
          if (pIVar11 != (ImGuiTable *)0x0) {
            DebugNodeTable(pIVar11);
          }
          iVar24 = iVar24 + 1;
          iVar20 = (pIVar8->Tables).Buf.Size;
        } while (iVar20 == (pIVar8->Tables).Map.Data.Size);
      }
    }
    else {
LAB_001561c1:
      atlas = (pIVar8->IO).Fonts;
      bVar10 = TreeNode("Fonts","Fonts (%d)",(ulong)(uint)(atlas->Fonts).Size);
      if (bVar10) {
        ShowFontAtlas(atlas);
        TreePop();
      }
      bVar10 = TreeNode("Settings");
      if (bVar10) {
        bVar10 = SmallButton("Clear");
        if (bVar10) {
          ClearIniSettings();
        }
        pIVar9 = GImGui;
        pIVar3 = GImGui->CurrentWindow;
        pIVar3->WriteAccessed = true;
        if (pIVar3->SkipItems == false) {
          (pIVar3->DC).CursorPos.x =
               (pIVar9->Style).ItemSpacing.x + (pIVar3->DC).CursorPosPrevLine.x;
          (pIVar3->DC).CursorPos.y = (pIVar3->DC).CursorPosPrevLine.y;
          (pIVar3->DC).CurrLineSize = (pIVar3->DC).PrevLineSize;
          (pIVar3->DC).CurrLineTextBaseOffset = (pIVar3->DC).PrevLineTextBaseOffset;
        }
        bVar10 = SmallButton("Save to memory");
        if (bVar10) {
          SaveIniSettingsToMemory((size_t *)0x0);
        }
        pIVar9 = GImGui;
        pIVar3 = GImGui->CurrentWindow;
        pIVar3->WriteAccessed = true;
        if (pIVar3->SkipItems == false) {
          (pIVar3->DC).CursorPos.x =
               (pIVar9->Style).ItemSpacing.x + (pIVar3->DC).CursorPosPrevLine.x;
          (pIVar3->DC).CursorPos.y = (pIVar3->DC).CursorPosPrevLine.y;
          (pIVar3->DC).CurrLineSize = (pIVar3->DC).PrevLineSize;
          (pIVar3->DC).CurrLineTextBaseOffset = (pIVar3->DC).PrevLineTextBaseOffset;
        }
        bVar10 = SmallButton("Save to disk");
        if (bVar10) {
          SaveIniSettingsToDisk((pIVar8->IO).IniFilename);
        }
        pIVar9 = GImGui;
        pIVar3 = GImGui->CurrentWindow;
        pIVar3->WriteAccessed = true;
        if (pIVar3->SkipItems == false) {
          (pIVar3->DC).CursorPos.x =
               (pIVar9->Style).ItemSpacing.x + (pIVar3->DC).CursorPosPrevLine.x;
          (pIVar3->DC).CursorPos.y = (pIVar3->DC).CursorPosPrevLine.y;
          (pIVar3->DC).CurrLineSize = (pIVar3->DC).PrevLineSize;
          (pIVar3->DC).CurrLineTextBaseOffset = (pIVar3->DC).PrevLineTextBaseOffset;
        }
        if ((pIVar8->IO).IniFilename == (char *)0x0) {
          TextUnformatted("<NULL>",(char *)0x0);
        }
        else {
          Text("\"%s\"");
        }
        Text("SettingsDirtyTimer %.2f",SUB84((double)pIVar8->SettingsDirtyTimer,0));
        bVar10 = TreeNode("SettingsHandlers","Settings handlers: (%d)",
                          (ulong)(uint)(pIVar8->SettingsHandlers).Size);
        if (bVar10) {
          if (0 < (pIVar8->SettingsHandlers).Size) {
            lVar13 = 0;
            lVar18 = 0;
            do {
              BulletText("%s",*(undefined8 *)
                               ((long)&((pIVar8->SettingsHandlers).Data)->TypeName + lVar13));
              lVar18 = lVar18 + 1;
              lVar13 = lVar13 + 0x48;
            } while (lVar18 < (pIVar8->SettingsHandlers).Size);
          }
          TreePop();
        }
        bVar10 = TreeNode("SettingsWindows","Settings packed data: Windows: %d bytes",
                          (ulong)(uint)(pIVar8->SettingsWindows).Buf.Size);
        if (bVar10) {
          pcVar15 = (pIVar8->SettingsWindows).Buf.Data;
          if (pcVar15 != (char *)0x0) {
            p = (ImGuiWindowSettings *)(pcVar15 + 4);
            do {
              Text("0x%08X \"%s\" Pos (%d,%d) Size (%d,%d) Collapsed=%d",(ulong)p->ID,p + 1,
                   (ulong)(uint)(int)(p->Pos).x,(ulong)(uint)(int)(p->Pos).y,
                   (ulong)(uint)(int)(p->Size).x,(ulong)(uint)(int)(p->Size).y,(ulong)p->Collapsed);
              p = ImChunkStream<ImGuiWindowSettings>::next_chunk(&pIVar8->SettingsWindows,p);
            } while (p != (ImGuiWindowSettings *)0x0);
          }
          TreePop();
        }
        bVar10 = TreeNode("SettingsTables","Settings packed data: Tables: %d bytes",
                          (ulong)(uint)(pIVar8->SettingsTables).Buf.Size);
        if (bVar10) {
          pcVar15 = (pIVar8->SettingsTables).Buf.Data;
          if (pcVar15 != (char *)0x0) {
            settings = (ImGuiTableSettings *)(pcVar15 + 4);
            do {
              DebugNodeTableSettings(settings);
              settings = ImChunkStream<ImGuiTableSettings>::next_chunk
                                   (&pIVar8->SettingsTables,settings);
            } while (settings != (ImGuiTableSettings *)0x0);
          }
          TreePop();
        }
        iVar20 = (pIVar8->SettingsIniData).Buf.Size;
        uVar16 = (ulong)(iVar20 - 1);
        if (iVar20 == 0) {
          uVar16 = 0;
        }
        bVar10 = TreeNode("SettingsIniData","Settings unpacked data (.ini): %d bytes",uVar16);
        if (bVar10) {
          pcVar15 = (pIVar8->SettingsIniData).Buf.Data;
          pcVar14 = ImGuiTextBuffer::EmptyString;
          if (pcVar15 != (char *)0x0) {
            pcVar14 = pcVar15;
          }
          buf._4_4_ = GImGui->FontSize * 20.0;
          buf[0] = '\0';
          buf[1] = '\0';
          buf[2] = -0x80;
          buf[3] = -0x80;
          InputTextMultiline("##Ini",pcVar14,(long)(pIVar8->SettingsIniData).Buf.Size,(ImVec2 *)buf,
                             0x4000,(ImGuiInputTextCallback)0x0,(void *)0x0);
          TreePop();
        }
        TreePop();
      }
      bVar10 = TreeNode("Internal state");
      if (bVar10) {
        Text("WINDOWING");
        pIVar9 = GImGui;
        pIVar3 = GImGui->CurrentWindow;
        pIVar3->WriteAccessed = true;
        fVar27 = (pIVar9->Style).IndentSpacing + (pIVar3->DC).Indent.x;
        (pIVar3->DC).Indent.x = fVar27;
        (pIVar3->DC).CursorPos.x = fVar27 + (pIVar3->Pos).x + (pIVar3->DC).ColumnsOffset.x;
        pcVar14 = "NULL";
        pcVar15 = "NULL";
        if (pIVar8->HoveredWindow != (ImGuiWindow *)0x0) {
          pcVar15 = pIVar8->HoveredWindow->Name;
        }
        Text("HoveredWindow: \'%s\'",pcVar15);
        pcVar15 = "NULL";
        if (pIVar8->HoveredWindow != (ImGuiWindow *)0x0) {
          pcVar15 = pIVar8->HoveredWindow->RootWindow->Name;
        }
        Text("HoveredWindow->Root: \'%s\'",pcVar15);
        pcVar15 = "NULL";
        if (pIVar8->HoveredWindowUnderMovingWindow != (ImGuiWindow *)0x0) {
          pcVar15 = pIVar8->HoveredWindowUnderMovingWindow->Name;
        }
        Text("HoveredWindowUnderMovingWindow: \'%s\'",pcVar15);
        pcVar15 = "NULL";
        if (pIVar8->MovingWindow != (ImGuiWindow *)0x0) {
          pcVar15 = pIVar8->MovingWindow->Name;
        }
        Text("MovingWindow: \'%s\'",pcVar15);
        pIVar9 = GImGui;
        pIVar3 = GImGui->CurrentWindow;
        pIVar3->WriteAccessed = true;
        fVar27 = (pIVar3->DC).Indent.x - (pIVar9->Style).IndentSpacing;
        (pIVar3->DC).Indent.x = fVar27;
        (pIVar3->DC).CursorPos.x = fVar27 + (pIVar3->Pos).x + (pIVar3->DC).ColumnsOffset.x;
        Text("ITEMS");
        pIVar9 = GImGui;
        pIVar3 = GImGui->CurrentWindow;
        pIVar3->WriteAccessed = true;
        fVar27 = (pIVar9->Style).IndentSpacing + (pIVar3->DC).Indent.x;
        (pIVar3->DC).Indent.x = fVar27;
        (pIVar3->DC).CursorPos.x = fVar27 + (pIVar3->Pos).x + (pIVar3->DC).ColumnsOffset.x;
        Text("ActiveId: 0x%08X/0x%08X (%.2f sec), AllowOverlap: %d, Source: %s",
             SUB84((double)pIVar8->ActiveIdTimer,0),(ulong)pIVar8->ActiveId,
             (ulong)pIVar8->ActiveIdPreviousFrame,(ulong)pIVar8->ActiveIdAllowOverlap,
             *(undefined8 *)(&DAT_003f12a0 + (ulong)pIVar8->ActiveIdSource * 8));
        pcVar15 = "NULL";
        if (pIVar8->ActiveIdWindow != (ImGuiWindow *)0x0) {
          pcVar15 = pIVar8->ActiveIdWindow->Name;
        }
        Text("ActiveIdWindow: \'%s\'",pcVar15);
        Text("HoveredId: 0x%08X/0x%08X (%.2f sec), AllowOverlap: %d",
             SUB84((double)pIVar8->HoveredIdTimer,0),(ulong)pIVar8->HoveredId,
             (ulong)pIVar8->HoveredIdPreviousFrame,(ulong)pIVar8->HoveredIdAllowOverlap);
        Text("DragDrop: %d, SourceId = 0x%08X, Payload \"%s\" (%d bytes)",
             (ulong)pIVar8->DragDropActive,(ulong)(pIVar8->DragDropPayload).SourceId,
             (pIVar8->DragDropPayload).DataType);
        pIVar9 = GImGui;
        pIVar3 = GImGui->CurrentWindow;
        pIVar3->WriteAccessed = true;
        fVar27 = (pIVar3->DC).Indent.x - (pIVar9->Style).IndentSpacing;
        (pIVar3->DC).Indent.x = fVar27;
        (pIVar3->DC).CursorPos.x = fVar27 + (pIVar3->Pos).x + (pIVar3->DC).ColumnsOffset.x;
        Text("NAV,FOCUS");
        pIVar9 = GImGui;
        pIVar3 = GImGui->CurrentWindow;
        pIVar3->WriteAccessed = true;
        fVar27 = (pIVar9->Style).IndentSpacing + (pIVar3->DC).Indent.x;
        (pIVar3->DC).Indent.x = fVar27;
        (pIVar3->DC).CursorPos.x = fVar27 + (pIVar3->Pos).x + (pIVar3->DC).ColumnsOffset.x;
        pcVar15 = "NULL";
        if (pIVar8->NavWindow != (ImGuiWindow *)0x0) {
          pcVar15 = pIVar8->NavWindow->Name;
        }
        Text("NavWindow: \'%s\'",pcVar15);
        Text("NavId: 0x%08X, NavLayer: %d",(ulong)pIVar8->NavId,(ulong)pIVar8->NavLayer);
        Text("NavInputSource: %s",*(undefined8 *)(&DAT_003f12a0 + (ulong)pIVar8->NavInputSource * 8)
            );
        Text("NavActive: %d, NavVisible: %d",(ulong)(pIVar8->IO).NavActive,
             (ulong)(pIVar8->IO).NavVisible);
        Text("NavActivateId: 0x%08X, NavInputId: 0x%08X",(ulong)pIVar8->NavActivateId,
             (ulong)pIVar8->NavInputId);
        Text("NavDisableHighlight: %d, NavDisableMouseHover: %d",(ulong)pIVar8->NavDisableHighlight,
             (ulong)pIVar8->NavDisableMouseHover);
        Text("NavFocusScopeId = 0x%08X",(ulong)pIVar8->NavFocusScopeId);
        if (pIVar8->NavWindowingTarget != (ImGuiWindow *)0x0) {
          pcVar14 = pIVar8->NavWindowingTarget->Name;
        }
        Text("NavWindowingTarget: \'%s\'",pcVar14);
        pIVar9 = GImGui;
        pIVar3 = GImGui->CurrentWindow;
        pIVar3->WriteAccessed = true;
        fVar27 = (pIVar3->DC).Indent.x - (pIVar9->Style).IndentSpacing;
        (pIVar3->DC).Indent.x = fVar27;
        (pIVar3->DC).CursorPos.x = fVar27 + (pIVar3->Pos).x + (pIVar3->DC).ColumnsOffset.x;
        TreePop();
      }
      if (((local_1d8->ShowWindowsRects != false) ||
          ((pIVar8->DebugMetricsConfig).ShowWindowsBeginOrder == true)) &&
         (0 < *(int *)local_198._0_8_)) {
        lVar13 = 0;
        do {
          pIVar3 = (pIVar8->Windows).Data[lVar13];
          if (pIVar3->WasActive == true) {
            pIVar12 = GetForegroundDrawList();
            if (local_1d8->ShowWindowsRects == true) {
              buf._0_16_ = (undefined1  [16])
                           ShowMetricsWindow::Funcs::GetWindowRect(pIVar3,*local_1b8);
              ImDrawList::AddRect(pIVar12,(ImVec2 *)buf,(ImVec2 *)(buf + 8),0xff8000ff,0.0,0,1.0);
            }
            if (((pIVar8->DebugMetricsConfig).ShowWindowsBeginOrder == true) &&
               ((pIVar3->Flags & 0x1000000) == 0)) {
              ImFormatString(buf,0x20,"%d",(ulong)(uint)(int)pIVar3->BeginOrderWithinContext);
              local_1e0.x = (pIVar3->Pos).x + GImGui->FontSize;
              local_1e0.y = GImGui->FontSize + (pIVar3->Pos).y;
              ImDrawList::AddRectFilled(pIVar12,&pIVar3->Pos,&local_1e0,0xff6464c8,0.0,0);
              ImDrawList::AddText(pIVar12,&pIVar3->Pos,0xffffffff,buf,(char *)0x0);
            }
          }
          lVar13 = lVar13 + 1;
        } while (lVar13 < *(int *)local_198._0_8_);
      }
      if ((pIVar8->DebugMetricsConfig).ShowTablesRects != true) {
LAB_00156c3a:
        End();
        return;
      }
      iVar20 = (pIVar8->Tables).Buf.Size;
      if (iVar20 == (pIVar8->Tables).Map.Data.Size) {
        iVar24 = 0;
        do {
          if (iVar20 <= iVar24) goto LAB_00156c3a;
          pIVar11 = ImPool<ImGuiTable>::TryGetBufData((ImPool<ImGuiTable> *)local_1c8._0_8_,iVar24);
          if ((pIVar11 != (ImGuiTable *)0x0) &&
             (pIVar8->FrameCount + -1 <= pIVar11->LastFrameActive)) {
            pIVar12 = GetForegroundDrawList();
            if (*local_1d0 < 6) {
              buf._0_16_ = (undefined1  [16])
                           ShowMetricsWindow::Funcs::GetTableRect(pIVar11,*local_1d0,-1);
              ImDrawList::AddRect(pIVar12,(ImVec2 *)buf,(ImVec2 *)(buf + 8),0xff8000ff,0.0,0,1.0);
            }
            else if (0 < pIVar11->ColumnsCount) {
              iVar20 = 0;
              do {
                buf._0_16_ = (undefined1  [16])
                             ShowMetricsWindow::Funcs::GetTableRect(pIVar11,*local_1d0,iVar20);
                bVar10 = iVar20 == pIVar11->HoveredColumnBody;
                col = 0xff8000ff;
                if (bVar10) {
                  col = 0xff80ffff;
                }
                ImDrawList::AddRect(pIVar12,(ImVec2 *)buf,(ImVec2 *)(buf + 8),col,0.0,0,
                                    *(float *)(&DAT_0038039c + (ulong)bVar10 * 4));
                iVar20 = iVar20 + 1;
              } while (iVar20 < pIVar11->ColumnsCount);
            }
          }
          iVar24 = iVar24 + 1;
          iVar20 = (pIVar8->Tables).Buf.Size;
        } while (iVar20 == (pIVar8->Tables).Map.Data.Size);
      }
    }
  }
  pcVar15 = "int ImPool<ImGuiTable>::GetBufSize() const [T = ImGuiTable]";
LAB_00156c30:
  __assert_fail("Buf.Size == Map.Data.Size",
                "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/imgui_internal.h"
                ,0x279,pcVar15);
}

Assistant:

void ImGui::ShowMetricsWindow(bool* p_open)
{
    if (!Begin("Dear ImGui Metrics/Debugger", p_open))
    {
        End();
        return;
    }

    ImGuiContext& g = *GImGui;
    ImGuiIO& io = g.IO;
    ImGuiMetricsConfig* cfg = &g.DebugMetricsConfig;

    // Basic info
    Text("Dear ImGui %s", GetVersion());
    Text("Application average %.3f ms/frame (%.1f FPS)", 1000.0f / io.Framerate, io.Framerate);
    Text("%d vertices, %d indices (%d triangles)", io.MetricsRenderVertices, io.MetricsRenderIndices, io.MetricsRenderIndices / 3);
    Text("%d active windows (%d visible)", io.MetricsActiveWindows, io.MetricsRenderWindows);
    Text("%d active allocations", io.MetricsActiveAllocations);
    //SameLine(); if (SmallButton("GC")) { g.GcCompactAll = true; }

    Separator();

    // Debugging enums
    enum { WRT_OuterRect, WRT_OuterRectClipped, WRT_InnerRect, WRT_InnerClipRect, WRT_WorkRect, WRT_Content, WRT_ContentIdeal, WRT_ContentRegionRect, WRT_Count }; // Windows Rect Type
    const char* wrt_rects_names[WRT_Count] = { "OuterRect", "OuterRectClipped", "InnerRect", "InnerClipRect", "WorkRect", "Content", "ContentIdeal", "ContentRegionRect" };
    enum { TRT_OuterRect, TRT_InnerRect, TRT_WorkRect, TRT_HostClipRect, TRT_InnerClipRect, TRT_BackgroundClipRect, TRT_ColumnsRect, TRT_ColumnsWorkRect, TRT_ColumnsClipRect, TRT_ColumnsContentHeadersUsed, TRT_ColumnsContentHeadersIdeal, TRT_ColumnsContentFrozen, TRT_ColumnsContentUnfrozen, TRT_Count }; // Tables Rect Type
    const char* trt_rects_names[TRT_Count] = { "OuterRect", "InnerRect", "WorkRect", "HostClipRect", "InnerClipRect", "BackgroundClipRect", "ColumnsRect", "ColumnsWorkRect", "ColumnsClipRect", "ColumnsContentHeadersUsed", "ColumnsContentHeadersIdeal", "ColumnsContentFrozen", "ColumnsContentUnfrozen" };
    if (cfg->ShowWindowsRectsType < 0)
        cfg->ShowWindowsRectsType = WRT_WorkRect;
    if (cfg->ShowTablesRectsType < 0)
        cfg->ShowTablesRectsType = TRT_WorkRect;

    struct Funcs
    {
        static ImRect GetTableRect(ImGuiTable* table, int rect_type, int n)
        {
            if (rect_type == TRT_OuterRect)                     { return table->OuterRect; }
            else if (rect_type == TRT_InnerRect)                { return table->InnerRect; }
            else if (rect_type == TRT_WorkRect)                 { return table->WorkRect; }
            else if (rect_type == TRT_HostClipRect)             { return table->HostClipRect; }
            else if (rect_type == TRT_InnerClipRect)            { return table->InnerClipRect; }
            else if (rect_type == TRT_BackgroundClipRect)       { return table->BgClipRect; }
            else if (rect_type == TRT_ColumnsRect)              { ImGuiTableColumn* c = &table->Columns[n]; return ImRect(c->MinX, table->InnerClipRect.Min.y, c->MaxX, table->InnerClipRect.Min.y + table->LastOuterHeight); }
            else if (rect_type == TRT_ColumnsWorkRect)          { ImGuiTableColumn* c = &table->Columns[n]; return ImRect(c->WorkMinX, table->WorkRect.Min.y, c->WorkMaxX, table->WorkRect.Max.y); }
            else if (rect_type == TRT_ColumnsClipRect)          { ImGuiTableColumn* c = &table->Columns[n]; return c->ClipRect; }
            else if (rect_type == TRT_ColumnsContentHeadersUsed){ ImGuiTableColumn* c = &table->Columns[n]; return ImRect(c->WorkMinX, table->InnerClipRect.Min.y, c->ContentMaxXHeadersUsed, table->InnerClipRect.Min.y + table->LastFirstRowHeight); } // Note: y1/y2 not always accurate
            else if (rect_type == TRT_ColumnsContentHeadersIdeal){ImGuiTableColumn* c = &table->Columns[n]; return ImRect(c->WorkMinX, table->InnerClipRect.Min.y, c->ContentMaxXHeadersIdeal, table->InnerClipRect.Min.y + table->LastFirstRowHeight); }
            else if (rect_type == TRT_ColumnsContentFrozen)     { ImGuiTableColumn* c = &table->Columns[n]; return ImRect(c->WorkMinX, table->InnerClipRect.Min.y, c->ContentMaxXFrozen, table->InnerClipRect.Min.y + table->LastFirstRowHeight); }
            else if (rect_type == TRT_ColumnsContentUnfrozen)   { ImGuiTableColumn* c = &table->Columns[n]; return ImRect(c->WorkMinX, table->InnerClipRect.Min.y + table->LastFirstRowHeight, c->ContentMaxXUnfrozen, table->InnerClipRect.Max.y); }
            IM_ASSERT(0);
            return ImRect();
        }

        static ImRect GetWindowRect(ImGuiWindow* window, int rect_type)
        {
            if (rect_type == WRT_OuterRect)                 { return window->Rect(); }
            else if (rect_type == WRT_OuterRectClipped)     { return window->OuterRectClipped; }
            else if (rect_type == WRT_InnerRect)            { return window->InnerRect; }
            else if (rect_type == WRT_InnerClipRect)        { return window->InnerClipRect; }
            else if (rect_type == WRT_WorkRect)             { return window->WorkRect; }
            else if (rect_type == WRT_Content)       { ImVec2 min = window->InnerRect.Min - window->Scroll + window->WindowPadding; return ImRect(min, min + window->ContentSize); }
            else if (rect_type == WRT_ContentIdeal)         { ImVec2 min = window->InnerRect.Min - window->Scroll + window->WindowPadding; return ImRect(min, min + window->ContentSizeIdeal); }
            else if (rect_type == WRT_ContentRegionRect)    { return window->ContentRegionRect; }
            IM_ASSERT(0);
            return ImRect();
        }
    };

    // Tools
    if (TreeNode("Tools"))
    {
        // The Item Picker tool is super useful to visually select an item and break into the call-stack of where it was submitted.
        if (Button("Item Picker.."))
            DebugStartItemPicker();
        SameLine();
        MetricsHelpMarker("Will call the IM_DEBUG_BREAK() macro to break in debugger.\nWarning: If you don't have a debugger attached, this will probably crash.");

        Checkbox("Show windows begin order", &cfg->ShowWindowsBeginOrder);
        Checkbox("Show windows rectangles", &cfg->ShowWindowsRects);
        SameLine();
        SetNextItemWidth(GetFontSize() * 12);
        cfg->ShowWindowsRects |= Combo("##show_windows_rect_type", &cfg->ShowWindowsRectsType, wrt_rects_names, WRT_Count, WRT_Count);
        if (cfg->ShowWindowsRects && g.NavWindow != NULL)
        {
            BulletText("'%s':", g.NavWindow->Name);
            Indent();
            for (int rect_n = 0; rect_n < WRT_Count; rect_n++)
            {
                ImRect r = Funcs::GetWindowRect(g.NavWindow, rect_n);
                Text("(%6.1f,%6.1f) (%6.1f,%6.1f) Size (%6.1f,%6.1f) %s", r.Min.x, r.Min.y, r.Max.x, r.Max.y, r.GetWidth(), r.GetHeight(), wrt_rects_names[rect_n]);
            }
            Unindent();
        }
        Checkbox("Show ImDrawCmd mesh when hovering", &cfg->ShowDrawCmdMesh);
        Checkbox("Show ImDrawCmd bounding boxes when hovering", &cfg->ShowDrawCmdBoundingBoxes);

        Checkbox("Show tables rectangles", &cfg->ShowTablesRects);
        SameLine();
        SetNextItemWidth(GetFontSize() * 12);
        cfg->ShowTablesRects |= Combo("##show_table_rects_type", &cfg->ShowTablesRectsType, trt_rects_names, TRT_Count, TRT_Count);
        if (cfg->ShowTablesRects && g.NavWindow != NULL)
        {
            for (int table_n = 0; table_n < g.Tables.GetBufSize(); table_n++)
            {
                ImGuiTable* table = g.Tables.TryGetBufData(table_n);
                if (table == NULL || table->LastFrameActive < g.FrameCount - 1 || (table->OuterWindow != g.NavWindow && table->InnerWindow != g.NavWindow))
                    continue;

                BulletText("Table 0x%08X (%d columns, in '%s')", table->ID, table->ColumnsCount, table->OuterWindow->Name);
                if (IsItemHovered())
                    GetForegroundDrawList()->AddRect(table->OuterRect.Min - ImVec2(1, 1), table->OuterRect.Max + ImVec2(1, 1), IM_COL32(255, 255, 0, 255), 0.0f, 0, 2.0f);
                Indent();
                char buf[128];
                for (int rect_n = 0; rect_n < TRT_Count; rect_n++)
                {
                    if (rect_n >= TRT_ColumnsRect)
                    {
                        if (rect_n != TRT_ColumnsRect && rect_n != TRT_ColumnsClipRect)
                            continue;
                        for (int column_n = 0; column_n < table->ColumnsCount; column_n++)
                        {
                            ImRect r = Funcs::GetTableRect(table, rect_n, column_n);
                            ImFormatString(buf, IM_ARRAYSIZE(buf), "(%6.1f,%6.1f) (%6.1f,%6.1f) Size (%6.1f,%6.1f) Col %d %s", r.Min.x, r.Min.y, r.Max.x, r.Max.y, r.GetWidth(), r.GetHeight(), column_n, trt_rects_names[rect_n]);
                            Selectable(buf);
                            if (IsItemHovered())
                                GetForegroundDrawList()->AddRect(r.Min - ImVec2(1, 1), r.Max + ImVec2(1, 1), IM_COL32(255, 255, 0, 255), 0.0f, 0, 2.0f);
                        }
                    }
                    else
                    {
                        ImRect r = Funcs::GetTableRect(table, rect_n, -1);
                        ImFormatString(buf, IM_ARRAYSIZE(buf), "(%6.1f,%6.1f) (%6.1f,%6.1f) Size (%6.1f,%6.1f) %s", r.Min.x, r.Min.y, r.Max.x, r.Max.y, r.GetWidth(), r.GetHeight(), trt_rects_names[rect_n]);
                        Selectable(buf);
                        if (IsItemHovered())
                            GetForegroundDrawList()->AddRect(r.Min - ImVec2(1, 1), r.Max + ImVec2(1, 1), IM_COL32(255, 255, 0, 255), 0.0f, 0, 2.0f);
                    }
                }
                Unindent();
            }
        }

        TreePop();
    }

    // Windows
    DebugNodeWindowsList(&g.Windows, "Windows");
    //DebugNodeWindowsList(&g.WindowsFocusOrder, "WindowsFocusOrder");

    // DrawLists
    int drawlist_count = 0;
    for (int viewport_i = 0; viewport_i < g.Viewports.Size; viewport_i++)
        drawlist_count += g.Viewports[viewport_i]->DrawDataBuilder.GetDrawListCount();
    if (TreeNode("DrawLists", "DrawLists (%d)", drawlist_count))
    {
        for (int viewport_i = 0; viewport_i < g.Viewports.Size; viewport_i++)
        {
            ImGuiViewportP* viewport = g.Viewports[viewport_i];
            for (int layer_i = 0; layer_i < IM_ARRAYSIZE(viewport->DrawDataBuilder.Layers); layer_i++)
                for (int draw_list_i = 0; draw_list_i < viewport->DrawDataBuilder.Layers[layer_i].Size; draw_list_i++)
                    DebugNodeDrawList(NULL, viewport->DrawDataBuilder.Layers[layer_i][draw_list_i], "DrawList");
        }
        TreePop();
    }

    // Viewports
    if (TreeNode("Viewports", "Viewports (%d)", g.Viewports.Size))
    {
        Indent(GetTreeNodeToLabelSpacing());
        RenderViewportsThumbnails();
        Unindent(GetTreeNodeToLabelSpacing());
        for (int i = 0; i < g.Viewports.Size; i++)
            DebugNodeViewport(g.Viewports[i]);
        TreePop();
    }

    // Details for Popups
    if (TreeNode("Popups", "Popups (%d)", g.OpenPopupStack.Size))
    {
        for (int i = 0; i < g.OpenPopupStack.Size; i++)
        {
            ImGuiWindow* window = g.OpenPopupStack[i].Window;
            BulletText("PopupID: %08x, Window: '%s'%s%s", g.OpenPopupStack[i].PopupId, window ? window->Name : "NULL", window && (window->Flags & ImGuiWindowFlags_ChildWindow) ? " ChildWindow" : "", window && (window->Flags & ImGuiWindowFlags_ChildMenu) ? " ChildMenu" : "");
        }
        TreePop();
    }

    // Details for TabBars
    if (TreeNode("TabBars", "Tab Bars (%d)", g.TabBars.GetAliveCount()))
    {
        for (int n = 0; n < g.TabBars.GetBufSize(); n++)
            if (ImGuiTabBar* tab_bar = g.TabBars.TryGetBufData(n))
            {
                PushID(tab_bar);
                DebugNodeTabBar(tab_bar, "TabBar");
                PopID();
            }
        TreePop();
    }

    // Details for Tables
    if (TreeNode("Tables", "Tables (%d)", g.Tables.GetAliveCount()))
    {
        for (int n = 0; n < g.Tables.GetBufSize(); n++)
            if (ImGuiTable* table = g.Tables.TryGetBufData(n))
                DebugNodeTable(table);
        TreePop();
    }

    // Details for Fonts
#ifndef IMGUI_DISABLE_DEMO_WINDOWS
    ImFontAtlas* atlas = g.IO.Fonts;
    if (TreeNode("Fonts", "Fonts (%d)", atlas->Fonts.Size))
    {
        ShowFontAtlas(atlas);
        TreePop();
    }
#endif

    // Details for Docking
#ifdef IMGUI_HAS_DOCK
    if (TreeNode("Docking"))
    {
        TreePop();
    }
#endif // #ifdef IMGUI_HAS_DOCK

    // Settings
    if (TreeNode("Settings"))
    {
        if (SmallButton("Clear"))
            ClearIniSettings();
        SameLine();
        if (SmallButton("Save to memory"))
            SaveIniSettingsToMemory();
        SameLine();
        if (SmallButton("Save to disk"))
            SaveIniSettingsToDisk(g.IO.IniFilename);
        SameLine();
        if (g.IO.IniFilename)
            Text("\"%s\"", g.IO.IniFilename);
        else
            TextUnformatted("<NULL>");
        Text("SettingsDirtyTimer %.2f", g.SettingsDirtyTimer);
        if (TreeNode("SettingsHandlers", "Settings handlers: (%d)", g.SettingsHandlers.Size))
        {
            for (int n = 0; n < g.SettingsHandlers.Size; n++)
                BulletText("%s", g.SettingsHandlers[n].TypeName);
            TreePop();
        }
        if (TreeNode("SettingsWindows", "Settings packed data: Windows: %d bytes", g.SettingsWindows.size()))
        {
            for (ImGuiWindowSettings* settings = g.SettingsWindows.begin(); settings != NULL; settings = g.SettingsWindows.next_chunk(settings))
                DebugNodeWindowSettings(settings);
            TreePop();
        }

        if (TreeNode("SettingsTables", "Settings packed data: Tables: %d bytes", g.SettingsTables.size()))
        {
            for (ImGuiTableSettings* settings = g.SettingsTables.begin(); settings != NULL; settings = g.SettingsTables.next_chunk(settings))
                DebugNodeTableSettings(settings);
            TreePop();
        }

#ifdef IMGUI_HAS_DOCK
#endif // #ifdef IMGUI_HAS_DOCK

        if (TreeNode("SettingsIniData", "Settings unpacked data (.ini): %d bytes", g.SettingsIniData.size()))
        {
            InputTextMultiline("##Ini", (char*)(void*)g.SettingsIniData.c_str(), g.SettingsIniData.Buf.Size, ImVec2(-FLT_MIN, GetTextLineHeight() * 20), ImGuiInputTextFlags_ReadOnly);
            TreePop();
        }
        TreePop();
    }

    // Misc Details
    if (TreeNode("Internal state"))
    {
        const char* input_source_names[] = { "None", "Mouse", "Keyboard", "Gamepad", "Nav", "Clipboard" }; IM_ASSERT(IM_ARRAYSIZE(input_source_names) == ImGuiInputSource_COUNT);

        Text("WINDOWING");
        Indent();
        Text("HoveredWindow: '%s'", g.HoveredWindow ? g.HoveredWindow->Name : "NULL");
        Text("HoveredWindow->Root: '%s'", g.HoveredWindow ? g.HoveredWindow->RootWindow->Name : "NULL");
        Text("HoveredWindowUnderMovingWindow: '%s'", g.HoveredWindowUnderMovingWindow ? g.HoveredWindowUnderMovingWindow->Name : "NULL");
        Text("MovingWindow: '%s'", g.MovingWindow ? g.MovingWindow->Name : "NULL");
        Unindent();

        Text("ITEMS");
        Indent();
        Text("ActiveId: 0x%08X/0x%08X (%.2f sec), AllowOverlap: %d, Source: %s", g.ActiveId, g.ActiveIdPreviousFrame, g.ActiveIdTimer, g.ActiveIdAllowOverlap, input_source_names[g.ActiveIdSource]);
        Text("ActiveIdWindow: '%s'", g.ActiveIdWindow ? g.ActiveIdWindow->Name : "NULL");
        Text("HoveredId: 0x%08X/0x%08X (%.2f sec), AllowOverlap: %d", g.HoveredId, g.HoveredIdPreviousFrame, g.HoveredIdTimer, g.HoveredIdAllowOverlap); // Data is "in-flight" so depending on when the Metrics window is called we may see current frame information or not
        Text("DragDrop: %d, SourceId = 0x%08X, Payload \"%s\" (%d bytes)", g.DragDropActive, g.DragDropPayload.SourceId, g.DragDropPayload.DataType, g.DragDropPayload.DataSize);
        Unindent();

        Text("NAV,FOCUS");
        Indent();
        Text("NavWindow: '%s'", g.NavWindow ? g.NavWindow->Name : "NULL");
        Text("NavId: 0x%08X, NavLayer: %d", g.NavId, g.NavLayer);
        Text("NavInputSource: %s", input_source_names[g.NavInputSource]);
        Text("NavActive: %d, NavVisible: %d", g.IO.NavActive, g.IO.NavVisible);
        Text("NavActivateId: 0x%08X, NavInputId: 0x%08X", g.NavActivateId, g.NavInputId);
        Text("NavDisableHighlight: %d, NavDisableMouseHover: %d", g.NavDisableHighlight, g.NavDisableMouseHover);
        Text("NavFocusScopeId = 0x%08X", g.NavFocusScopeId);
        Text("NavWindowingTarget: '%s'", g.NavWindowingTarget ? g.NavWindowingTarget->Name : "NULL");
        Unindent();

        TreePop();
    }

    // Overlay: Display windows Rectangles and Begin Order
    if (cfg->ShowWindowsRects || cfg->ShowWindowsBeginOrder)
    {
        for (int n = 0; n < g.Windows.Size; n++)
        {
            ImGuiWindow* window = g.Windows[n];
            if (!window->WasActive)
                continue;
            ImDrawList* draw_list = GetForegroundDrawList(window);
            if (cfg->ShowWindowsRects)
            {
                ImRect r = Funcs::GetWindowRect(window, cfg->ShowWindowsRectsType);
                draw_list->AddRect(r.Min, r.Max, IM_COL32(255, 0, 128, 255));
            }
            if (cfg->ShowWindowsBeginOrder && !(window->Flags & ImGuiWindowFlags_ChildWindow))
            {
                char buf[32];
                ImFormatString(buf, IM_ARRAYSIZE(buf), "%d", window->BeginOrderWithinContext);
                float font_size = GetFontSize();
                draw_list->AddRectFilled(window->Pos, window->Pos + ImVec2(font_size, font_size), IM_COL32(200, 100, 100, 255));
                draw_list->AddText(window->Pos, IM_COL32(255, 255, 255, 255), buf);
            }
        }
    }

    // Overlay: Display Tables Rectangles
    if (cfg->ShowTablesRects)
    {
        for (int table_n = 0; table_n < g.Tables.GetBufSize(); table_n++)
        {
            ImGuiTable* table = g.Tables.TryGetBufData(table_n);
            if (table == NULL || table->LastFrameActive < g.FrameCount - 1)
                continue;
            ImDrawList* draw_list = GetForegroundDrawList(table->OuterWindow);
            if (cfg->ShowTablesRectsType >= TRT_ColumnsRect)
            {
                for (int column_n = 0; column_n < table->ColumnsCount; column_n++)
                {
                    ImRect r = Funcs::GetTableRect(table, cfg->ShowTablesRectsType, column_n);
                    ImU32 col = (table->HoveredColumnBody == column_n) ? IM_COL32(255, 255, 128, 255) : IM_COL32(255, 0, 128, 255);
                    float thickness = (table->HoveredColumnBody == column_n) ? 3.0f : 1.0f;
                    draw_list->AddRect(r.Min, r.Max, col, 0.0f, 0, thickness);
                }
            }
            else
            {
                ImRect r = Funcs::GetTableRect(table, cfg->ShowTablesRectsType, -1);
                draw_list->AddRect(r.Min, r.Max, IM_COL32(255, 0, 128, 255));
            }
        }
    }

#ifdef IMGUI_HAS_DOCK
    // Overlay: Display Docking info
    if (show_docking_nodes && g.IO.KeyCtrl)
    {
    }
#endif // #ifdef IMGUI_HAS_DOCK

    End();
}